

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_split
          (HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,SpatialSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  unsigned_long uVar13;
  unsigned_long uVar14;
  PrimRef *pPVar15;
  ulong unaff_RBP;
  PrimRef *pPVar16;
  unsigned_long uVar17;
  int iVar18;
  ulong unaff_R14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  uint uVar23;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar36 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  pair<unsigned_long,_unsigned_long> pVar44;
  
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  iVar9 = split->pos;
  auVar12 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)split->dim & 0x1f)) * 0x10)
  ;
  auVar11 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)split->dim & 0x1f)) * 0x10)
  ;
  pPVar6 = this->prims0;
  pPVar16 = pPVar6 + uVar4;
  pPVar15 = pPVar6 + uVar5;
  uVar14 = 0;
  uVar13 = 0;
  aVar19 = _DAT_01feb9f0;
  aVar20 = _DAT_01feba00;
  aVar21 = _DAT_01feba00;
  aVar22 = _DAT_01feb9f0;
  aVar29 = _DAT_01feb9f0;
  aVar30 = _DAT_01feba00;
  aVar31 = _DAT_01feb9f0;
  aVar32 = _DAT_01feba00;
  do {
    pPVar15 = pPVar15 + -1;
    if (pPVar16 <= pPVar15) {
      do {
        aVar1 = (pPVar16->lower).field_0.field_1;
        aVar2 = (pPVar16->upper).field_0.field_1;
        fVar40 = aVar1.x + aVar2.x;
        fVar41 = aVar1.y + aVar2.y;
        fVar42 = aVar1.z + aVar2.z;
        fVar43 = aVar1.field_3.w + aVar2.field_3.w;
        uVar23 = (uint)((fVar40 * 0.5 - (split->mapping).ofs.field_0.v[0]) *
                        (split->mapping).scale.field_0.v[0] + -0.5);
        uVar26 = (uint)((fVar41 * 0.5 - (split->mapping).ofs.field_0.v[1]) *
                        (split->mapping).scale.field_0.v[1] + -0.5);
        uVar27 = (uint)((fVar42 * 0.5 - (split->mapping).ofs.field_0.v[2]) *
                        (split->mapping).scale.field_0.v[2] + -0.5);
        uVar28 = (uint)((fVar43 * 0.5 - (split->mapping).ofs.field_0.v[3]) *
                        (split->mapping).scale.field_0.v[3] + -0.5);
        uVar35 = -(uint)(0xe < (int)uVar23);
        uVar37 = -(uint)(0xe < (int)uVar26);
        uVar38 = -(uint)(0xe < (int)uVar27);
        uVar39 = -(uint)(0xe < (int)uVar28);
        uVar23 = ~uVar35 & uVar23;
        uVar26 = ~uVar37 & uVar26;
        uVar27 = ~uVar38 & uVar27;
        uVar28 = ~uVar39 & uVar28;
        auVar24._0_4_ = -(uint)((int)(~((int)uVar23 >> 0x1f) & (uVar35 & 0xf | uVar23)) < iVar9);
        auVar24._4_4_ = -(uint)((int)(~((int)uVar26 >> 0x1f) & (uVar37 & 0xf | uVar26)) < iVar9);
        auVar24._8_4_ = -(uint)((int)(~((int)uVar27 >> 0x1f) & (uVar38 & 0xf | uVar27)) < iVar9);
        auVar24._12_4_ = -(uint)((int)(~((int)uVar28 >> 0x1f) & (uVar39 & 0xf | uVar28)) < iVar9);
        uVar23 = movmskps((int)unaff_RBP,auVar24 & auVar11);
        unaff_RBP = (ulong)uVar23;
        if (uVar23 == 0) break;
        unaff_R14 = (ulong)((uint)(pPVar16->lower).field_0.m128[3] >> 0x1b);
        aVar29.m128 = (__m128)minps(aVar29.m128,(undefined1  [16])aVar1);
        aVar30.m128 = (__m128)maxps(aVar30.m128,(undefined1  [16])aVar2);
        auVar7._4_4_ = fVar41;
        auVar7._0_4_ = fVar40;
        auVar7._8_4_ = fVar42;
        auVar7._12_4_ = fVar43;
        aVar31.m128 = (__m128)minps(aVar31.m128,auVar7);
        auVar8._4_4_ = fVar41;
        auVar8._0_4_ = fVar40;
        auVar8._8_4_ = fVar42;
        auVar8._12_4_ = fVar43;
        aVar32.m128 = (__m128)maxps(aVar32.m128,auVar8);
        uVar13 = uVar13 + unaff_R14;
        pPVar16 = pPVar16 + 1;
      } while (pPVar16 <= pPVar15);
    }
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),pPVar15 < pPVar16);
    if (pPVar15 < pPVar16) {
LAB_00cfdbd1:
      uVar17 = (long)pPVar16 - (long)pPVar6 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar29;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar30;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar31;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar32;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar4;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar17;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar17;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar22;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar21;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar19;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar20;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar17;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar5;
      pVar44.second = uVar14;
      pVar44.first = uVar13;
      return pVar44;
    }
    while( true ) {
      aVar1 = (pPVar15->lower).field_0.field_1;
      aVar2 = (pPVar15->upper).field_0.field_1;
      auVar36._0_4_ = aVar1.x + aVar2.x;
      auVar36._4_4_ = aVar1.y + aVar2.y;
      auVar36._8_4_ = aVar1.z + aVar2.z;
      auVar36._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      uVar23 = (uint)((auVar36._0_4_ * 0.5 - (split->mapping).ofs.field_0.v[0]) *
                      (split->mapping).scale.field_0.v[0] + -0.5);
      uVar26 = (uint)((auVar36._4_4_ * 0.5 - (split->mapping).ofs.field_0.v[1]) *
                      (split->mapping).scale.field_0.v[1] + -0.5);
      uVar27 = (uint)((auVar36._8_4_ * 0.5 - (split->mapping).ofs.field_0.v[2]) *
                      (split->mapping).scale.field_0.v[2] + -0.5);
      uVar28 = (uint)((auVar36._12_4_ * 0.5 - (split->mapping).ofs.field_0.v[3]) *
                      (split->mapping).scale.field_0.v[3] + -0.5);
      uVar35 = -(uint)(0xe < (int)uVar23);
      uVar37 = -(uint)(0xe < (int)uVar26);
      uVar38 = -(uint)(0xe < (int)uVar27);
      uVar39 = -(uint)(0xe < (int)uVar28);
      uVar23 = ~uVar35 & uVar23;
      uVar26 = ~uVar37 & uVar26;
      uVar27 = ~uVar38 & uVar27;
      uVar28 = ~uVar39 & uVar28;
      auVar25._0_4_ = -(uint)((int)(~((int)uVar23 >> 0x1f) & (uVar35 & 0xf | uVar23)) < iVar9);
      auVar25._4_4_ = -(uint)((int)(~((int)uVar26 >> 0x1f) & (uVar37 & 0xf | uVar26)) < iVar9);
      auVar25._8_4_ = -(uint)((int)(~((int)uVar27 >> 0x1f) & (uVar38 & 0xf | uVar27)) < iVar9);
      auVar25._12_4_ = -(uint)((int)(~((int)uVar28 >> 0x1f) & (uVar39 & 0xf | uVar28)) < iVar9);
      iVar18 = movmskps((int)unaff_R14,auVar25 & auVar12);
      if (iVar18 != 0) break;
      unaff_R14 = (ulong)((uint)(pPVar15->lower).field_0.m128[3] >> 0x1b);
      aVar22.m128 = (__m128)minps(aVar22.m128,(undefined1  [16])aVar1);
      aVar21.m128 = (__m128)maxps(aVar21.m128,(undefined1  [16])aVar2);
      aVar19.m128 = (__m128)minps(aVar19.m128,auVar36);
      aVar20.m128 = (__m128)maxps(aVar20.m128,auVar36);
      uVar14 = uVar14 + unaff_R14;
      pPVar15 = pPVar15 + -1;
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),pPVar15 < pPVar16);
      if (pPVar15 < pPVar16) goto LAB_00cfdbd1;
    }
    if ((char)unaff_RBP != '\0') goto LAB_00cfdbd1;
    aVar1 = (pPVar15->lower).field_0.field_1;
    aVar2 = (pPVar15->upper).field_0.field_1;
    aVar29.m128 = (__m128)minps(aVar29.m128,(undefined1  [16])aVar1);
    aVar30.m128 = (__m128)maxps(aVar30.m128,(undefined1  [16])aVar2);
    auVar33._0_4_ = aVar2.x + aVar1.x;
    auVar33._4_4_ = aVar2.y + aVar1.y;
    auVar33._8_4_ = aVar2.z + aVar1.z;
    auVar33._12_4_ = aVar2.field_3.w + aVar1.field_3.w;
    aVar31.m128 = (__m128)minps(aVar31.m128,auVar33);
    aVar32.m128 = (__m128)maxps(aVar32.m128,auVar33);
    uVar13 = uVar13 + ((uint)(pPVar15->lower).field_0.m128[3] >> 0x1b);
    unaff_R14 = (ulong)((uint)(pPVar16->lower).field_0.m128[3] >> 0x1b);
    aVar2 = (pPVar16->lower).field_0.field_1;
    aVar3 = (pPVar16->upper).field_0.field_1;
    aVar22.m128 = (__m128)minps(aVar22.m128,(undefined1  [16])aVar2);
    aVar21.m128 = (__m128)maxps(aVar21.m128,(undefined1  [16])aVar3);
    (pPVar16->lower).field_0.field_1 = aVar1;
    uVar10 = *(undefined8 *)((long)&(pPVar15->upper).field_0 + 8);
    *(undefined8 *)&(pPVar16->upper).field_0 = *(undefined8 *)&(pPVar15->upper).field_0;
    *(undefined8 *)((long)&(pPVar16->upper).field_0 + 8) = uVar10;
    (pPVar15->lower).field_0.field_1 = aVar2;
    auVar34._0_4_ = aVar2.x + aVar3.x;
    auVar34._4_4_ = aVar2.y + aVar3.y;
    auVar34._8_4_ = aVar2.z + aVar3.z;
    auVar34._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar19.m128 = (__m128)minps(aVar19.m128,auVar34);
    aVar20.m128 = (__m128)maxps(aVar20.m128,auVar34);
    uVar14 = uVar14 + unaff_R14;
    (pPVar15->upper).field_0.field_1 = aVar3;
    pPVar16 = pPVar16 + 1;
  } while( true );
}

Assistant:

__noinline std::pair<size_t,size_t> sequential_spatial_split(const SpatialSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          /* init spatial mapping */
          const SpatialBinMapping<SPATIAL_BINS> &mapping = split.mapping;
          const vint4 vSplitPos(splitPos);
          const vbool4 vSplitMask( (int)splitDimMask );

          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) {
                                                const Vec3fa c = ref.bounds().center();
                                                return any(((vint4)mapping.bin(c) < vSplitPos) & vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });

          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);
          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }